

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupSpreadFlop(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  
  if (vFfMask->nSize < p->nRegs) {
    __assert_fail("Vec_IntSize(vFfMask) >= Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x379,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < vFfMask->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(vFfMask,iVar6);
    uVar1 = Gia_ManAppendCi(p_00);
    if (iVar2 != -1) {
      pGVar4 = Gia_ManRo(p,iVar5);
      pGVar4->Value = uVar1;
      iVar5 = iVar5 + 1;
    }
  }
  if (iVar5 != p->nRegs) {
    __assert_fail("k == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x386,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManObj(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar6 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_00,iVar6,iVar2);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_00,iVar6);
    pGVar4->Value = uVar1;
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < vFfMask->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(vFfMask,iVar6);
    if (iVar2 == -1) {
      Gia_ManAppendCo(p_00,0);
    }
    else {
      pGVar4 = Gia_ManRi(p,iVar5);
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      uVar1 = Gia_ManAppendCo(p_00,iVar2);
      pGVar4->Value = uVar1;
      iVar5 = iVar5 + 1;
    }
  }
  if (iVar5 == p->nRegs) {
    Gia_ManSetRegNum(p_00,vFfMask->nSize);
    return p_00;
  }
  __assert_fail("k == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x394,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupSpreadFlop( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, Entry;
    assert( Vec_IntSize(vFfMask) >= Gia_ManRegNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCi(pNew);
        else
            Gia_ManRo(p, k++)->Value = Gia_ManAppendCi(pNew);
    assert( k == Gia_ManRegNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCo( pNew, 0 );
        else
        {
            pObj = Gia_ManRi( p, k++ );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    assert( k == Gia_ManRegNum(p) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFfMask) );
    return pNew;
}